

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

size_t drwav__on_read(drwav_read_proc onRead,void *pUserData,void *pBufferOut,size_t bytesToRead,
                     drwav_uint64 *pCursor)

{
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  code *in_RDI;
  long *in_R8;
  size_t bytesRead;
  
  if (in_RDI == (code *)0x0) {
    __assert_fail("onRead != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/khang06[P]dsiflipencode/include/dr_wav.h"
                  ,0x602,
                  "size_t drwav__on_read(drwav_read_proc, void *, void *, size_t, drwav_uint64 *)");
  }
  if (in_R8 != (long *)0x0) {
    sVar1 = (*in_RDI)(in_RSI,in_RDX,in_RCX);
    *in_R8 = sVar1 + *in_R8;
    return sVar1;
  }
  __assert_fail("pCursor != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/khang06[P]dsiflipencode/include/dr_wav.h"
                ,0x603,
                "size_t drwav__on_read(drwav_read_proc, void *, void *, size_t, drwav_uint64 *)");
}

Assistant:

size_t drwav__on_read(drwav_read_proc onRead, void* pUserData, void* pBufferOut, size_t bytesToRead, drwav_uint64* pCursor)
{
    drwav_assert(onRead != NULL);
    drwav_assert(pCursor != NULL);

    size_t bytesRead = onRead(pUserData, pBufferOut, bytesToRead);
    *pCursor += bytesRead;
    return bytesRead;
}